

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void dereference_suite::get_wstring(void)

{
  index_type *piVar1;
  type tVar2;
  reference lhs;
  const_reference lhs_00;
  undefined1 local_b0 [8];
  const_iterator where_1;
  variable data_1;
  undefined1 local_50 [8];
  iterator where;
  variable data;
  
  piVar1 = &where.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)local_50,(basic_variable<std::allocator<char>_> *)piVar1);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                  ((iterator *)local_50);
  tVar2 = trial::dynamic::operator==(lhs,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("*where == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x755,"void dereference_suite::get_wstring()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  piVar1 = &where_1.
            super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
            .current.current;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)piVar1,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((const_iterator *)local_b0,(basic_variable<std::allocator<char>_> *)piVar1);
  lhs_00 = trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)local_b0);
  tVar2 = trial::dynamic::operator==(lhs_00,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("*where == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x75a,"void dereference_suite::get_wstring()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)local_b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  return;
}

Assistant:

void get_wstring()
{
    {
        variable data(L"bravo");
        auto where = data.begin();
        TRIAL_PROTOCOL_TEST(*where == L"bravo");
    }
    {
        const variable data(L"bravo");
        auto where = data.begin();
        TRIAL_PROTOCOL_TEST(*where == L"bravo");
    }
}